

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

nullable_omittable_field<discordpp::Snowflake> * __thiscall
discordpp::nullable_omittable_field<discordpp::Snowflake>::operator=
          (nullable_omittable_field<discordpp::Snowflake> *this)

{
  std::__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::reset
            ((__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> *)
             &this->super_field<discordpp::Snowflake>,(pointer)0x0);
  (this->super_field<discordpp::Snowflake>).s_ = omitted_e;
  return this;
}

Assistant:

virtual nullable_omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }